

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_upscale_impl(ggml_context *ctx,ggml_tensor *a,int ne0,int ne1,int ne2,int ne3,
                 ggml_scale_mode mode)

{
  ggml_tensor *tensor;
  int in_ECX;
  int in_EDX;
  ggml_tensor *in_RSI;
  int64_t in_RDI;
  int in_R8D;
  int in_R9D;
  ggml_tensor *result;
  
  if ((long)in_EDX < in_RSI->ne[0]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
               ,0x1084,"GGML_ASSERT(%s) failed","a->ne[0] <= ne0");
  }
  if ((long)in_ECX < in_RSI->ne[1]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
               ,0x1085,"GGML_ASSERT(%s) failed","a->ne[1] <= ne1");
  }
  if ((long)in_R8D < in_RSI->ne[2]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
               ,0x1086,"GGML_ASSERT(%s) failed","a->ne[2] <= ne2");
  }
  if ((long)in_R9D < in_RSI->ne[3]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
               ,0x1087,"GGML_ASSERT(%s) failed","a->ne[3] <= ne3");
  }
  tensor = ggml_new_tensor_4d(ctx,a._4_4_,CONCAT44(ne0,ne1),CONCAT44(ne2,ne3),(int64_t)result,in_RDI
                             );
  ggml_set_op_params_i32(tensor,0,ne3);
  tensor->op = GGML_OP_UPSCALE;
  tensor->src[0] = in_RSI;
  return tensor;
}

Assistant:

static struct ggml_tensor * ggml_upscale_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   ne0,
        int                   ne1,
        int                   ne2,
        int                   ne3,
        enum ggml_scale_mode  mode) {
    GGML_ASSERT(a->ne[0] <= ne0);
    GGML_ASSERT(a->ne[1] <= ne1);
    GGML_ASSERT(a->ne[2] <= ne2);
    GGML_ASSERT(a->ne[3] <= ne3);

    struct ggml_tensor * result = ggml_new_tensor_4d(ctx, a->type, ne0, ne1, ne2, ne3);

    ggml_set_op_params_i32(result, 0, mode);

    result->op     = GGML_OP_UPSCALE;
    result->src[0] = a;

    return result;
}